

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileInstaller::Parse
          (cmFileInstaller *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmCommand *pcVar1;
  bool bVar2;
  allocator local_29;
  string local_28;
  
  bVar2 = cmFileCopier::Parse(&this->super_cmFileCopier,args);
  if (!bVar2) {
    return false;
  }
  if ((this->Rename)._M_string_length != 0) {
    if ((*(uint *)&(this->super_cmFileCopier).field_0xa4 & 0xfffffffe) != 4) {
      pcVar1 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
      std::__cxx11::string::string
                ((string *)&local_28,
                 "INSTALL option RENAME may be used only with FILES or PROGRAMS.",&local_29);
      cmCommand::SetError(pcVar1,&local_28);
      goto LAB_00358e65;
    }
    if (0x20 < (ulong)((long)(this->super_cmFileCopier).Files.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_cmFileCopier).Files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      pcVar1 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
      std::__cxx11::string::string
                ((string *)&local_28,"INSTALL option RENAME may be used only with one file.",
                 &local_29);
      cmCommand::SetError(pcVar1,&local_28);
      goto LAB_00358e65;
    }
  }
  bVar2 = HandleInstallDestination(this);
  if (!bVar2) {
    return false;
  }
  if ((byte)(this->MessageLazy + this->MessageAlways + this->MessageNever) < 2) {
    return true;
  }
  pcVar1 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
  std::__cxx11::string::string
            ((string *)&local_28,
             "INSTALL options MESSAGE_ALWAYS, MESSAGE_LAZY, and MESSAGE_NEVER are mutually exclusive."
             ,&local_29);
  cmCommand::SetError(pcVar1,&local_28);
LAB_00358e65:
  std::__cxx11::string::~string((string *)&local_28);
  return false;
}

Assistant:

bool cmFileInstaller::Parse(std::vector<std::string> const& args)
{
  if(!this->cmFileCopier::Parse(args))
    {
    return false;
    }

  if(!this->Rename.empty())
    {
    if(this->InstallType != cmInstallType_FILES &&
       this->InstallType != cmInstallType_PROGRAMS)
      {
      this->FileCommand->SetError("INSTALL option RENAME may be used "
                                  "only with FILES or PROGRAMS.");
      return false;
      }
    if(this->Files.size() > 1)
      {
      this->FileCommand->SetError("INSTALL option RENAME may be used "
                                  "only with one file.");
      return false;
      }
    }

  if(!this->HandleInstallDestination())
    {
    return false;
    }

  if(((this->MessageAlways?1:0) +
      (this->MessageLazy?1:0) +
      (this->MessageNever?1:0)) > 1)
    {
    this->FileCommand->SetError("INSTALL options MESSAGE_ALWAYS, "
                                "MESSAGE_LAZY, and MESSAGE_NEVER "
                                "are mutually exclusive.");
    return false;
    }

  return true;
}